

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::source_linenum_formatter<spdlog::details::null_scoped_padder>::format
          (source_linenum_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,
          tm *param_2,memory_buf_t *dest)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *__src;
  ptrdiff_t _Num;
  size_t __n;
  ulong uVar4;
  format_int local_50;
  
  uVar1 = (msg->source).line;
  if (uVar1 != 0) {
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    pcVar3 = ::fmt::v6::format_int::format_decimal(&local_50,(ulong)uVar2);
    __src = pcVar3;
    if ((int)uVar1 < 0) {
      __src = pcVar3 + -1;
      pcVar3[-1] = '-';
    }
    __n = (long)(local_50.buffer_ + 0x15) - (long)__src;
    uVar4 = (dest->super_buffer<char>).size_ + __n;
    local_50.str_ = __src;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar4);
    }
    if (local_50.buffer_ + 0x15 != __src) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,__n);
    }
    (dest->super_buffer<char>).size_ = uVar4;
  }
  return;
}

Assistant:

explicit B_formatter(padding_info padinfo)
        : flag_formatter(padinfo)
    {}